

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNCodeBody::gen_code(CTPNCodeBody *this,int param_2,int param_3)

{
  CTPNStm *pCVar1;
  int iVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  CTPNCodeBody *pCVar5;
  CTcCodeStream **ppCVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  uint uVar7;
  CTPNCodeBody *in_RDI;
  uint uVar8;
  uint uVar9;
  CTPNCodeBody *outer_1;
  CTPNCodeBody *outer;
  int ctx_idx;
  CTcCodeBodyCtx *cur_ctx;
  CTcCodeLabel *asi_lbl;
  ulong end_ofs;
  ulong start_ofs;
  CTcSymLocal *lcl;
  int i;
  defval_ctx dctx;
  CTcPrsSymtab *tab;
  tct3_method_gen_ctx gen_ctx;
  undefined8 in_stack_fffffffffffffe78;
  _func_void_void_ptr_CTcSymbol_ptr *func;
  tct3_method_gen_ctx *ctx;
  int iVar10;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  CTcPrsSymtab *pCVar11;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea4;
  CTcCodeStream *stream;
  CTcGenTarg *in_stack_fffffffffffffeb0;
  tct3_method_gen_ctx *in_stack_fffffffffffffeb8;
  undefined1 *in_stack_fffffffffffffec0;
  CTcTokFileDesc *in_stack_fffffffffffffec8;
  CTcPrsSymtab *in_stack_fffffffffffffed0;
  CTcCodeLabel *in_stack_fffffffffffffed8;
  CTcGenTarg *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  tct3_method_gen_ctx *in_stack_fffffffffffffef0;
  CTcCodeStream *in_stack_ffffffffffffff18;
  CTcCodeStream *code_start_ofs;
  CTcGenTarg *start_ofs_00;
  CTcCodeBodyCtx *local_b0;
  undefined1 *in_stack_ffffffffffffff60;
  int include_lines;
  tct3_method_gen_ctx *in_stack_ffffffffffffff68;
  uchar opc;
  CTcGenTarg *in_stack_ffffffffffffff70;
  int local_88;
  long local_78;
  int local_6c;
  CTcPrsSymtab *local_68;
  
  if ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 2 & 1) == 0) {
    code_start_ofs = G_cs_main;
    if (((byte)in_RDI->field_0xd4 >> 2 & 1) != 0) {
      code_start_ofs = G_cs_static;
    }
    iVar10 = (in_RDI->super_CTPNCodeBodyBase).opt_argc_;
    stream = (CTcCodeStream *)&stack0xffffffffffffffa0;
    func = (_func_void_void_ptr_CTcSymbol_ptr *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                    (in_RDI->super_CTPNCodeBodyBase).argc_);
    pCVar11 = (CTcPrsSymtab *)
              CONCAT44((int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                       (uint)(*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 1 & 1));
    uVar7 = (uint)(in_RDI->field_0xd4 & 1);
    uVar9 = (uint)(*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 9 & 1);
    uVar8 = (uint)(*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 6 & 1);
    start_ofs_00 = G_cg;
    CTcGenTarg::open_method
              (in_stack_fffffffffffffeb0,stream,
               (CTcSymbol *)CONCAT44(in_stack_fffffffffffffea4,uVar8),
               (CTcAbsFixup **)CONCAT44(in_stack_fffffffffffffe9c,uVar9),
               (CTPNCodeBody *)CONCAT44(in_stack_fffffffffffffe94,uVar7),pCVar11,
               (int)in_stack_fffffffffffffec0,(int)in_stack_fffffffffffffec8,
               (int)in_stack_fffffffffffffed0,(int)in_stack_fffffffffffffed8,
               (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
    if ((in_RDI->super_CTPNCodeBodyBase).start_desc_ != (CTcTokFileDesc *)0x0) {
      CTcCodeStream::add_line_rec
                ((CTcCodeStream *)in_stack_fffffffffffffeb0,(CTcTokFileDesc *)stream,
                 CONCAT44(in_stack_fffffffffffffea4,uVar8));
    }
    if ((in_RDI->super_CTPNCodeBodyBase).lcltab_ != (CTcPrsSymtab *)0x0) {
      for (local_68 = CTcPrsSymtab::get_parent((in_RDI->super_CTPNCodeBodyBase).lcltab_);
          local_68 != (CTcPrsSymtab *)0x0; local_68 = CTcPrsSymtab::get_parent(local_68)) {
        CTcCodeStream::set_local_frame
                  ((CTcCodeStream *)CONCAT44(in_stack_fffffffffffffe94,uVar7),pCVar11);
      }
    }
    ppCVar6 = &G_cs;
    CTcCodeStream::set_local_frame
              ((CTcCodeStream *)CONCAT44(in_stack_fffffffffffffe94,uVar7),pCVar11);
    if ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 3 & 1) != 0) {
      CTPNConst::s_gen_code_int(0x285d7a);
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf,(size_t)ppCVar6);
      in_stack_ffffffffffffff18 = G_cs;
      iVar2 = CTcGenTarg::get_predef_meta_idx(G_cg,4);
      CTcDataStream::write
                (&in_stack_ffffffffffffff18->super_CTcDataStream,(int)(char)iVar2,__buf_00,
                 (size_t)ppCVar6);
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcGenTarg::note_push((CTcGenTarg *)0x285e0f);
      CTcGenTarg::note_pop((CTcGenTarg *)0x285e1e);
      CTcSymLocal::s_gen_code_setlcl_stk(0,0x285e33);
      if ((in_RDI->super_CTPNCodeBodyBase).lcltab_ != (CTcPrsSymtab *)0x0) {
        CTcPrsSymtab::enum_entries
                  ((CTcPrsSymtab *)CONCAT44(in_stack_fffffffffffffe84,iVar10),func,(void *)0x285e5a)
        ;
      }
    }
    if ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 & 1) != 0) {
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      ppCVar6 = &G_cs;
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)(in_RDI->super_CTPNCodeBodyBase).argc_,
                 __buf_01,0x402388);
      CTcGenTarg::note_push((CTcGenTarg *)0x285eba);
      CTcSymLocal::gen_code_setlcl((CTcSymLocal *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
    }
    if ((in_RDI->super_CTPNCodeBodyBase).lcltab_ != (CTcPrsSymtab *)0x0) {
      defval_ctx::defval_ctx((defval_ctx *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
      CTcPrsSymtab::enum_entries
                ((CTcPrsSymtab *)CONCAT44(in_stack_fffffffffffffe84,iVar10),func,(void *)0x285f16);
      defval_ctx::sort((defval_ctx *)0x285f25);
      for (local_88 = 0; local_88 < local_6c; local_88 = local_88 + 1) {
        ppCVar6 = (CTcCodeStream **)(long)local_88;
        in_stack_ffffffffffffff70 = *(CTcGenTarg **)(local_78 + (long)ppCVar6 * 8);
        iVar2 = CTcSymLocalBase::is_named_param((CTcSymLocalBase *)in_stack_ffffffffffffff70);
        if (iVar2 == 0) {
          defval_ctx::gen_opt_positional((CTcSymLocal *)CONCAT44(in_stack_fffffffffffffea4,uVar8));
        }
        else {
          CTcSymLocalBase::get_defval_expr((CTcSymLocalBase *)in_stack_ffffffffffffff70);
          iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x285fac);
          if (iVar2 == 0) {
            in_stack_fffffffffffffeb8 =
                 (tct3_method_gen_ctx *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
            CTPNConst::s_gen_code_str_by_mode
                      ((CTcSymbol *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
            call_internal_bif((char *)CONCAT44(in_stack_fffffffffffffe84,iVar10),
                              (int)((ulong)func >> 0x20),(int)func);
            in_stack_fffffffffffffee0 =
                 (CTcGenTarg *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
            in_stack_fffffffffffffec0 =
                 (undefined1 *)((long)in_stack_fffffffffffffee0[-1].predef_meta_idx_ + 0x1f);
            in_stack_fffffffffffffed8 = CTcPrsNode::gen_jump_ahead((uchar)((ulong)func >> 0x38));
            CTcGenTarg::note_pop((CTcGenTarg *)0x2860d7);
            in_stack_fffffffffffffed0 = (CTcPrsSymtab *)CTcGenTarg::get_exc_table(G_cg);
            in_stack_ffffffffffffff60 = in_stack_fffffffffffffec0;
            in_stack_ffffffffffffff68 = in_stack_fffffffffffffeb8;
            in_stack_fffffffffffffec8 =
                 (CTcTokFileDesc *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
            CTcT3ExcTable::add_catch
                      ((CTcT3ExcTable *)CONCAT44(in_stack_fffffffffffffea4,uVar8),
                       CONCAT44(in_stack_fffffffffffffe9c,uVar9),
                       CONCAT44(in_stack_fffffffffffffe94,uVar7),(ulong)pCVar11,
                       CONCAT44(in_stack_fffffffffffffe84,iVar10));
            CTcGenTarg::note_push((CTcGenTarg *)0x28614b);
            CTcGenTarg::write_op
                      (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
            CTcGenTarg::note_pop((CTcGenTarg *)0x286172);
            pCVar4 = CTcSymLocalBase::get_defval_expr((CTcSymLocalBase *)in_stack_ffffffffffffff70);
            (**(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar4,0);
            CTcPrsNode::def_label_pos((CTcCodeLabel *)CONCAT44(in_stack_fffffffffffffe94,uVar7));
          }
          else {
            in_stack_fffffffffffffef0 =
                 (tct3_method_gen_ctx *)
                 CTcSymLocalBase::get_defval_expr((CTcSymLocalBase *)in_stack_ffffffffffffff70);
            (**((CTcPrsNodeBase *)&in_stack_fffffffffffffef0->stream)->_vptr_CTcPrsNodeBase)
                      (in_stack_fffffffffffffef0,0);
            CTPNConst::s_gen_code_str_by_mode
                      ((CTcSymbol *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
            call_internal_bif((char *)CONCAT44(in_stack_fffffffffffffe84,iVar10),
                              (int)((ulong)func >> 0x20),(int)func);
          }
          pCVar11 = (CTcPrsSymtab *)0x0;
          iVar10 = 0;
          func = (_func_void_void_ptr_CTcSymbol_ptr *)((ulong)func & 0xffffffff00000000);
          ppCVar6 = (CTcCodeStream **)0x0;
          (**(code **)(*(long *)in_stack_ffffffffffffff70 + 200))
                    (in_stack_ffffffffffffff70,1,1,0,"=",0);
        }
      }
      defval_ctx::~defval_ctx((defval_ctx *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
    }
    iVar2 = CTcGenTarg::is_eval_for_dyn(G_cg);
    if ((((iVar2 != 0) &&
         ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 0xb & 1) != 0)) &&
        ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 6 & 1) != 0)) &&
       (((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 7 & 1) != 0 ||
        ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 8 & 1) != 0)))) {
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcDataStream::write(&G_cs->super_CTcDataStream,4,__buf_02,(size_t)ppCVar6);
      CTPNConst::s_gen_code_int(0x2862f7);
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcGenTarg::note_push((CTcGenTarg *)0x28631a);
      CTcGenTarg::note_pop((CTcGenTarg *)0x286329);
      opc = (uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38);
      if ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 8 & 1) == 0) {
        CTcGenTarg::write_op(in_stack_ffffffffffffff70,opc);
      }
      else {
        CTcGenTarg::write_op(in_stack_ffffffffffffff70,opc);
      }
      CTcGenTarg::note_pop((CTcGenTarg *)0x286381);
    }
    local_b0 = (in_RDI->super_CTPNCodeBodyBase).ctx_head_;
    while( true ) {
      include_lines = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
      iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      if (local_b0 == (CTcCodeBodyCtx *)0x0) break;
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcDataStream::write(&G_cs->super_CTcDataStream,4,__buf_03,(size_t)ppCVar6);
      CTPNConst::s_gen_code_int(0x2863ec);
      CTcGenTarg::write_op
                (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      CTcGenTarg::note_push((CTcGenTarg *)0x28640f);
      CTcGenTarg::note_pop((CTcGenTarg *)0x28641e);
      if (((local_b0->level_ == 1) &&
          ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 10 & 1) == 0)) &&
         (((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 6 & 1) != 0 &&
          (((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 7 & 1) != 0 ||
           ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 8 & 1) != 0)))))) {
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        CTcGenTarg::note_push((CTcGenTarg *)0x2864da);
        CTPNConst::s_gen_code_int(0x2864e4);
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        pCVar5 = CTPNCodeBodyBase::get_outermost_enclosing
                           ((CTPNCodeBodyBase *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
        if ((pCVar5 == (CTPNCodeBody *)0x0) ||
           (iVar2 = CTPNCodeBodyBase::local_ctx_needs_full_method_ctx
                              (&pCVar5->super_CTPNCodeBodyBase), iVar2 == 0)) {
          CTcGenTarg::write_op
                    (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        }
        else {
          CTcGenTarg::write_op
                    (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        }
        CTcGenTarg::note_pop(G_cg,2);
      }
      CTcSymLocal::s_gen_code_setlcl_stk(0,0x286575);
      local_b0 = local_b0->nxt_;
    }
    if ((((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 3 & 1) != 0) &&
        ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 6 & 1) != 0)) &&
       (((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 4 & 1) != 0 ||
        ((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 5 & 1) != 0)))) {
      pCVar5 = CTPNCodeBodyBase::get_outermost_enclosing
                         ((CTPNCodeBodyBase *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
      if (((*(ushort *)&(in_RDI->super_CTPNCodeBodyBase).field_0xb8 >> 5 & 1) == 0) &&
         ((pCVar5 == (CTPNCodeBody *)0x0 ||
          (iVar3 = CTPNCodeBodyBase::local_ctx_needs_full_method_ctx
                             (&pCVar5->super_CTPNCodeBodyBase), iVar3 == 0)))) {
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      }
      else {
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
      }
      CTcGenTarg::note_push((CTcGenTarg *)0x2866b4);
      if ((in_RDI->super_CTPNCodeBodyBase).local_ctx_var_ < 0x100) {
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        ppCVar6 = &G_cs;
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,
                   (int)(char)(in_RDI->super_CTPNCodeBodyBase).local_ctx_var_,__buf_04,0x402388);
        CTcDataStream::write(&G_cs->super_CTcDataStream,1,__buf_05,(size_t)ppCVar6);
        CTcGenTarg::note_pop((CTcGenTarg *)0x28671f);
      }
      else {
        CTcSymLocal::s_gen_code_getlcl(0,0x286736);
        CTPNConst::s_gen_code_int(0x286740);
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        CTcGenTarg::write_op
                  (in_stack_ffffffffffffff70,(uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        CTcGenTarg::note_pop(G_cg,3);
      }
    }
    if ((in_RDI->super_CTPNCodeBodyBase).stm_ != (CTPNStm *)0x0) {
      pCVar1 = (in_RDI->super_CTPNCodeBodyBase).stm_;
      (**(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                (pCVar1,1);
    }
    ctx = (tct3_method_gen_ctx *)in_RDI->named_arg_tables_;
    CTcGenTarg::close_method
              (in_stack_fffffffffffffee0,iVar2,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (long)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (CTcNamedArgTab *)in_stack_fffffffffffffef0);
    pCVar11 = CTcCodeStream::get_first_frame(G_cs);
    in_RDI->first_nested_symtab_ = pCVar11;
    iVar2 = CTcGenTarg::is_eval_for_debug(G_cg);
    if (iVar2 == 0) {
      build_debug_table((CTPNCodeBody *)in_stack_ffffffffffffff70,(ulong)in_stack_ffffffffffffff68,
                        include_lines);
    }
    CTPNCodeBodyBase::check_unreferenced_labels
              ((CTPNCodeBodyBase *)CONCAT44(in_stack_fffffffffffffe84,iVar10));
    if (G_disasm_out != (CTcUnasOut *)0x0) {
      show_disassembly(in_RDI,(unsigned_long)start_ofs_00,(unsigned_long)code_start_ofs,
                       (unsigned_long)in_stack_ffffffffffffff18);
    }
    CTcGenTarg::close_method_cleanup((CTcGenTarg *)CONCAT44(in_stack_fffffffffffffe84,iVar10),ctx);
  }
  return;
}

Assistant:

void CTPNCodeBody::gen_code(int, int)
{
    /* if I've been replaced, don't bother generating any code */
    if (replaced_)
        return;

    /* 
     *   Open the method header.
     *   
     *   Generate to the static stream if this is a static initializer
     *   method, otherwise to the main stream. 
     *   
     *   Anchor the fixups in the associated symbol table entry, if any.  We
     *   maintain our own fixup list if we don't have a symbol, otherwise we
     *   use the one from our symbol table entry - in either case, we have to
     *   keep track of it ourselves, because a code body might be reachable
     *   through multiple references (a function, for example, has a global
     *   symbol table entry - fixups referencing us might already have been
     *   created by the time we generate our code).  
     */
    tct3_method_gen_ctx gen_ctx;
    G_cg->open_method(
        is_static_ ? G_cs_static : G_cs_main,
        fixup_owner_sym_, fixup_list_anchor_,
        this, gototab_, argc_, opt_argc_, varargs_,
        is_constructor_, op_overload_, self_valid_, &gen_ctx);

    /* 
     *   Add a line record at the start of the method for all of the
     *   generated method prolog code.  Some prolog code can throw errors, so
     *   we want a line record at the start of the code body to indicate the
     *   location of any such errors. 
     */
    if (start_desc_ != 0)
        G_cs->add_line_rec(start_desc_, start_linenum_);

    /* 
     *   Add each local symbol table enclosing the code body's primary
     *   local symbol table to the frame list.  The outermost code body
     *   table can be outside the primary code body table for situations
     *   such as anonymous functions.  Since these tables are outside of
     *   any statements, we must explicitly add them to ensure that they
     *   are assigned debugging frame ID's and are written to the debug
     *   data.
     */
    if (lcltab_ != 0)
    {
        /* add each frame outside the primary frame to the code gen list */
        for (CTcPrsSymtab *tab = lcltab_->get_parent() ; tab != 0 ;
             tab = tab->get_parent())
            G_cs->set_local_frame(tab);
    }

    /* the method's local symbol table is now the active symbol table */
    G_cs->set_local_frame(lcltab_);

    /* if we have a local context, initialize it */
    if (has_local_ctx_)
    {
        /* write code to create the new Vector to store the context locals */
        CTPNConst::s_gen_code_int(local_ctx_arr_size_);
        G_cg->write_op(OPC_DUP);
        G_cg->write_op(OPC_NEW1);
        G_cs->write(2);
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_VECTOR));

        /* retrieve the object value */
        G_cg->write_op(OPC_GETR0);

        /*
         *   we duplicated the vector size argument, then we popped it and
         *   pushed the object; so we have a maximum of one extra push and a
         *   net of zero 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /* store the new object in the context local variable */
        CTcSymLocal::s_gen_code_setlcl_stk(local_ctx_var_, FALSE);

        /* 
         *   go through our symbol table, and copy each parameter that's
         *   also a context local into its context local slot 
         */
        if (lcltab_ != 0)
            lcltab_->enum_entries(&enum_for_param_ctx, this);
    }

    /* 
     *   If we have a varargs-list parameter, generate the code to set up
     *   the list value from the actual parameters.  Note that we must do
     *   this after we set up the local context, in case the varargs list
     *   parameter variable is a context local, in which case it will need
     *   to be stored in the context, in which case we need the context to
     *   be initialized first.  
     */
    if (varargs_list_)
    {
        /* generate the PUSHPARLST instruction to create the list */
        G_cg->write_op(OPC_PUSHPARLST);
        G_cs->write((uchar)argc_);

        /* 
         *   we pushed at least one value (the list); we don't know how many
         *   others we might have pushed, but it doesn't matter because the
         *   interpreter is responsible for checking for stack space 
         */
        G_cg->note_push();

        /* store the list in our varargs parameter list local */
        varargs_list_local_->gen_code_setlcl();
    }

    /* 
     *   generate other special parameter setup code: named arguments and
     *   default values 
     */
    if (lcltab_ != 0)
    {
        /* 
         *   generate bindings for named parameters and optional positional
         *   parameters that don't have default expressions, and build the
         *   array of optional parameters with default expressions
         */
        defval_ctx dctx;
        lcltab_->enum_entries(&enum_for_named_params, &dctx);

        /* sort the default value list in left-to-right parameter order */
        dctx.sort();

        /* generate the default value assignments */
        for (int i = 0 ; i < dctx.nv ; ++i)
        {
            /* get this local */
            CTcSymLocal *lcl = dctx.v[i];

            /* generate the proper code depending on the parameter type */
            if (lcl->is_named_param())
            {
                /* 
                 *   Named parameter with a default.
                 *   
                 *   If the default is a constant, call t3GetNamedArg(name,
                 *   defVal).  This returns the argument value, or the
                 *   default value if the argument isn't defined.
                 *   
                 *   If the default value expression isn't a constant, we
                 *   can't evaluate it until we know whether or not the
                 *   argument is defined, since the expression could have
                 *   side effects that we don't want to trigger unless we
                 *   really need to evaluate the expression.  So in this
                 *   case, we have to look up the argument first, and set the
                 *   default only the argument doesn't exist.
                 *   
                 *   Note that we could handle both cases with the
                 *   non-constant handling, since it would make no difference
                 *   semantically to defer evaluating a constant until after
                 *   checking to see if the argument exists.  However, the
                 *   separate version for constants yields faster and smaller
                 *   byte code, so we use it as an optimization for a common
                 *   case.  
                 */
                if (lcl->get_defval_expr()->is_const())
                {
                    /* constant default - use t3GetNamedArg(name, defval) */
                    lcl->get_defval_expr()->gen_code(FALSE, FALSE);
                    CTPNConst::s_gen_code_str_by_mode(lcl);
                    call_internal_bif("t3GetNamedArg",
                                      TCERR_NAMED_PARAM_MISSING_FUNC, 2);
                }
                else
                {
                    /* 
                     *   Non-constant default value.  We don't want to
                     *   evaluate the argument unless necessary in this case,
                     *   so start by calling t3GetNamedArg(name).  This will
                     *   throw an error if the argument doesn't exist, so do
                     *   this in an implied try/catch block.  If we return
                     *   without an error, simply proceed with the value
                     *   returned.  If an error is thrown, catch the error
                     *   and *then* evaluate the default value.  
                     */
                    ulong start_ofs = G_cs->get_ofs();
                    CTPNConst::s_gen_code_str_by_mode(lcl);
                    call_internal_bif("t3GetNamedArg",
                                      TCERR_NAMED_PARAM_MISSING_FUNC, 1);

                    /* that's the end of the implied 'try' section */
                    ulong end_ofs = G_cs->get_ofs() - 1;

                    /* 
                     *   On a successful return, the result value will be at
                     *   top of stack, so just jump past the evaluation of
                     *   the default value.  Since we're done with this
                     *   branch, clear what it left on the stack, since the
                     *   'catch' branch will leave the same thing on the
                     *   stack in parallel.  
                     */
                    CTcCodeLabel *asi_lbl = gen_jump_ahead(OPC_JMP);
                    G_cg->note_pop();

                    /* this is the start of our implied 'catch' block */
                    G_cg->get_exc_table()->add_catch(
                        start_ofs, end_ofs, VM_INVALID_OBJ, G_cs->get_ofs());
                    G_cg->note_push();

                    /* discard the exception */
                    G_cg->write_op(OPC_DISC);
                    G_cg->note_pop();

                    /* generate the default value expression */
                    lcl->get_defval_expr()->gen_code(FALSE, FALSE);

                    /* this is the common 'assign' branch point */
                    def_label_pos(asi_lbl);
                }

                /* assign the top-of-stack value to the local */
                lcl->gen_code_asi(TRUE, 1, TC_ASI_SIMPLE, "=", 0, 
                                  FALSE, FALSE, 0);
            }
            else
            {
                /* it's a positional parameter - generate it */
                dctx.gen_opt_positional(lcl);
            }
        }
    }

    /*
     *   If this is a dynamic function (a DynamicFunc object), and it's
     *   defined with the 'function' keyword (not 'method'), and it has a
     *   'self', we need to set up the method context to point to the
     *   enclosing frame object's method context.  
     */
    if (G_cg->is_eval_for_dyn()
        && is_dyn_func_
        && self_valid_
        && (self_referenced_ || full_method_ctx_referenced_))
    {
        /*
         *   We need the method context.  For dyanmic code, the invokee is
         *   the DynamicFunc, and the DynamicFunc makes the context available
         *   via its indexed value [1].  
         */
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_INVOKEE);
        CTPNConst::s_gen_code_int(1);
        G_cg->write_op(OPC_INDEX);

        /* we pushed the invokee and popped it again with the INDEX */
        G_cg->note_push();
        G_cg->note_pop();

        /* 
         *   The invokee will store the appropriate object in its [1]
         *   element, according to which type of method context we need.
         *   Generate the appropriate 'set' for it.  
         */
        if (full_method_ctx_referenced_)
        {
            /* load the full method context */
            G_cg->write_op(OPC_LOADCTX);
        }
        else
        {
            /* load the 'self' object */
            G_cg->write_op(OPC_SETSELF);
        }

        /* that pops the context object */
        G_cg->note_pop();
    }

    /* 
     *   Generate code to initialize each enclosing-context-pointer local -
     *   these variables allow us to find the context objects while we're
     *   running inside this function.
     *   
     *   Before 3.1, we had to generate context level 1 last, because this
     *   level sets 'self' for an anonymous function to the saved 'self' from
     *   the context.  Starting with 3.1, the stack frame has a separate
     *   entry for the invokee, so we no longer conflate the anonymous
     *   function object with 'self'.  
     */
    CTcCodeBodyCtx *cur_ctx;
    int ctx_idx;
    for (ctx_idx = 0, cur_ctx = ctx_head_ ; cur_ctx != 0 ;
         cur_ctx = cur_ctx->nxt_, ++ctx_idx)
    {
        /* 
         *   Get this context value, stored in invokee[n+2].  Note that the
         *   context object indices start at 2 because the FUNCPTR value for
         *   the code itself is at index 1.  
         */
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_INVOKEE);
        CTPNConst::s_gen_code_int(ctx_idx + 2);
        G_cg->write_op(OPC_INDEX);

        /* 
         *   we pushed the object, then popped the object and index and
         *   pushed the indexed value - this is a net of no change with one
         *   maximum push 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /*
         *   If this is context level 1, and this context has a 'self', and
         *   we need either 'self' or the full method context from the
         *   lexically enclosing scope, generate code to load the self or the
         *   full method context (as appropriate) from our local context.
         *   
         *   The enclosing method context is always stored in the context at
         *   level 1, because this is inherently shared context for all
         *   enclosed lexical scopes.  We thus only have to worry about this
         *   for context level 1.  
         */
        if (cur_ctx->level_ == 1
            && !is_anon_method_
            && self_valid_
            && (self_referenced_ || full_method_ctx_referenced_))
        {
            CTPNCodeBody *outer;
            
            /* 
             *   we just put our context object on the stack in preparation
             *   for storing it - make a duplicate copy of it for our own
             *   purposes 
             */
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
            
            /* get the saved method context from the context object */
            CTPNConst::s_gen_code_int(TCPRS_LOCAL_CTX_METHODCTX);
            G_cg->write_op(OPC_INDEX);
                
            /* 
             *   Load the context.  We must check the outermost context to
             *   determine what it stored, because we must load whatever it
             *   stored.  
             */
            if ((outer = get_outermost_enclosing()) != 0
                && outer->local_ctx_needs_full_method_ctx())
            {
                /* load the full method context */
                G_cg->write_op(OPC_LOADCTX);
            }
            else
            {
                /* load the 'self' object */
                G_cg->write_op(OPC_SETSELF);
            }
            
            /* 
             *   we popped two values and pushed one in the INDEX, then
             *   popped a value in the LOADCTX or SETSELF: the net is removal
             *   of two elements and no additional maximum depth 
             */
            G_cg->note_pop(2);
        }

        /* store the context value in the appropriate local variable */
        CTcSymLocal::s_gen_code_setlcl_stk(cur_ctx->var_num_, FALSE);
    }

    /* 
     *   if we created our own local context, and we have a 'self' object,
     *   and we need access to the 'self' object or the full method context
     *   from anonymous functions that refer to the local context, generate
     *   code to store the appropriate data in the local context 
     */
    if (has_local_ctx_ && self_valid_
        && (local_ctx_needs_self_ || local_ctx_needs_full_method_ctx_))
    {
        /* 
         *   Check to see what we need.  If we're marked as needing the full
         *   method context, OR our outermost enclosing context has the full
         *   context, we need to generate the full context.  Intermediate
         *   nesting levels of anonymous functions can need less context than
         *   inner levels, but the context we actually generate at the outer
         *   level depends on the innermost function's needs.  So we simply
         *   need to follow the lead of the outermost level, since that's
         *   what the inner levels will all do.  
         */
        CTPNCodeBody *outer = get_outermost_enclosing();
        if (local_ctx_needs_full_method_ctx_
            || (outer != 0 && outer->local_ctx_needs_full_method_ctx()))
        {
            /* 
             *   we need the full method context - generate code to store it
             *   and push a reference to it onto the stack 
             */
            G_cg->write_op(OPC_STORECTX);
        }
        else
        {
            /* we only need 'self' - push it */
            G_cg->write_op(OPC_PUSHSELF);
        }

        /* we just pushed one value */
        G_cg->note_push();

        /* assign the value to the context variable */
        if (local_ctx_var_ <= 255 && TCPRS_LOCAL_CTX_METHODCTX <= 255)
        {
            /* we can make the assignment with a single instruction */
            G_cg->write_op(OPC_SETINDLCL1I8);
            G_cs->write((uchar)local_ctx_var_);
            G_cs->write(TCPRS_LOCAL_CTX_METHODCTX);

            /* that pops one value */
            G_cg->note_pop();
        }
        else
        {
            /* get the context object */
            CTcSymLocal::s_gen_code_getlcl(local_ctx_var_, FALSE);
            
            /* store the data in the local context object */
            CTPNConst::s_gen_code_int(TCPRS_LOCAL_CTX_METHODCTX);
            G_cg->write_op(OPC_SETIND);

            /* discard the indexed result */
            G_cg->write_op(OPC_DISC);
        
            /* 
             *   the SETIND pops three values and pushes one, then we pop one
             *   more with the DISC - this is a net three pops with no extra
             *   maximum depth 
             */
            G_cg->note_pop(3);
        }
    }

    /* generate the compound statement, if we have one */
    if (stm_ != 0)
        stm_->gen_code(TRUE, TRUE);

#ifdef T3_DEBUG
    if (G_cg->get_sp_depth() != 0)
    {
        printf("---> stack depth is %d after block codegen (line %ld)!\n",
               G_cg->get_sp_depth(), end_linenum_);
        if (fixup_owner_sym_ != 0)
            printf("---> code block for %.*s\n",
                   (int)fixup_owner_sym_->get_sym_len(),
                   fixup_owner_sym_->get_sym());
    }
#endif

    /* close the method */
    G_cg->close_method(local_cnt_, lcltab_, end_desc_, end_linenum_,
                       &gen_ctx, named_arg_tables_);

    /* remember the head of the nested symbol table list */
    first_nested_symtab_ = G_cs->get_first_frame();

    /* 
     *   Generate debug records.  If we're in debug mode, include the full
     *   symbolic debugging information, including source line locations.
     *   For release builds, include only the local variable symbols and
     *   frame information; we need those even in release builds, for
     *   reflection purposes.
     *   
     *   If we're generating this code for a debugger evaluation, omit
     *   symbols.  We don't need reflection support for debugger expressions,
     *   since there doesn't seem to be any practical reason you'd need it
     *   there.  
     */
    if (!G_cg->is_eval_for_debug())
        build_debug_table(gen_ctx.method_ofs, G_debug);

    /* check for unreferenced labels and issue warnings */
    check_unreferenced_labels();

    /* show the disassembly of the code block if desired */
    if (G_disasm_out != 0)
        show_disassembly(gen_ctx.method_ofs,
                         gen_ctx.code_start_ofs, gen_ctx.code_end_ofs);

    /* clean up globals for the end of the method */
    G_cg->close_method_cleanup(&gen_ctx);
}